

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O3

void load_vector_int<QPDF::HSharedObjectEntry,int>
               (BitStream *bit_stream,int nitems,
               vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *vec,
               int bits_wanted,offset_in_HSharedObjectEntry_to_int field)

{
  pointer *ppHVar1;
  pointer pHVar2;
  pointer pHVar3;
  iterator __position;
  pointer pHVar4;
  int iVar5;
  logic_error *this;
  ulong uVar6;
  type ii;
  type ii_1;
  ulong uVar7;
  HSharedObjectEntry local_40;
  
  pHVar2 = (vec->
           super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>).
           _M_impl.super__Vector_impl_data._M_start;
  pHVar3 = (vec->
           super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  uVar7 = 0;
  while( true ) {
    if (nitems < 0) {
      QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(nitems);
    }
    if ((long)nitems == uVar7) {
      uVar7 = ((long)(vec->
                     super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(vec->
                     super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
      if ((uVar7 & 0xffffffff80000000) != 0) {
        QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(uVar7);
      }
      if ((int)uVar7 == nitems) {
        BitStream::skipToNextByte(bit_stream);
        return;
      }
      this = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this,"vector has wrong size in load_vector_int");
      __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    if (pHVar2 == pHVar3) {
      local_40.nobjects_minus_one = 0;
      local_40.delta_group_length = 0;
      local_40.signature_present = 0;
      __position._M_current =
           (vec->
           super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (vec->
          super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>::
        _M_realloc_insert<QPDF::HSharedObjectEntry>(vec,__position,&local_40);
      }
      else {
        (__position._M_current)->nobjects_minus_one = 0;
        (__position._M_current)->delta_group_length = 0;
        (__position._M_current)->signature_present = 0;
        ppHVar1 = &(vec->
                   super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *ppHVar1 = *ppHVar1 + 1;
      }
    }
    if (bits_wanted < 0) {
      QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(bits_wanted);
    }
    iVar5 = BitStream::getBitsInt(bit_stream,(long)bits_wanted);
    pHVar4 = (vec->
             super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar6 = ((long)(vec->
                   super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pHVar4 >> 2) *
            -0x5555555555555555;
    if (uVar6 < uVar7 || uVar6 - uVar7 == 0) break;
    *(int *)((long)&pHVar4->delta_group_length + field) = iVar5;
    uVar7 = uVar7 + 1;
    field = field + 0xc;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7);
}

Assistant:

static void
load_vector_int(
    BitStream& bit_stream, int nitems, std::vector<T>& vec, int bits_wanted, int_type T::* field)
{
    bool append = vec.empty();
    // nitems times, read bits_wanted from the given bit stream, storing results in the ith vector
    // entry.

    for (size_t i = 0; i < QIntC::to_size(nitems); ++i) {
        if (append) {
            vec.push_back(T());
        }
        vec.at(i).*field = bit_stream.getBitsInt(QIntC::to_size(bits_wanted));
    }
    if (QIntC::to_int(vec.size()) != nitems) {
        throw std::logic_error("vector has wrong size in load_vector_int");
    }
    // The PDF spec says that each hint table starts at a byte boundary.  Each "row" actually must
    // start on a byte boundary.
    bit_stream.skipToNextByte();
}